

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_class.cpp
# Opt level: O3

void __thiscall libtorrent::peer_class::set_info(peer_class *this,peer_class_info *pci)

{
  int iVar1;
  int iVar2;
  
  this->ignore_unchoke_slots = pci->ignore_unchoke_slots;
  this->connection_limit_factor = pci->connection_limit_factor;
  ::std::__cxx11::string::_M_assign((string *)&this->label);
  iVar1 = pci->upload_limit;
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  if (iVar1 - 1U < 9) {
    iVar2 = 10;
  }
  aux::bandwidth_channel::throttle((bandwidth_channel *)this,iVar2);
  iVar1 = pci->download_limit;
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  if (iVar1 - 1U < 9) {
    iVar2 = 10;
  }
  aux::bandwidth_channel::throttle((bandwidth_channel *)&this->field_0x18,iVar2);
  iVar1 = pci->upload_priority;
  if (0xfe < iVar1) {
    iVar1 = 0xff;
  }
  if (iVar1 < 2) {
    iVar1 = 1;
  }
  (this->priority)._M_elems[0] = iVar1;
  iVar1 = 0xff;
  if (pci->download_priority < 0xff) {
    iVar1 = pci->download_priority;
  }
  if (iVar1 < 2) {
    iVar1 = 1;
  }
  (this->priority)._M_elems[1] = iVar1;
  return;
}

Assistant:

void peer_class::set_info(peer_class_info const* pci)
	{
		ignore_unchoke_slots = pci->ignore_unchoke_slots;
		connection_limit_factor = pci->connection_limit_factor;
		label = pci->label;
		set_upload_limit(pci->upload_limit);
		set_download_limit(pci->download_limit);
		priority[aux::peer_connection::upload_channel] = std::max(1, std::min(255, pci->upload_priority));
		priority[aux::peer_connection::download_channel] = std::max(1, std::min(255, pci->download_priority));
	}